

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep.c
# Opt level: O3

int lsrkStep_TakeStepSSPs3(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  undefined8 *puVar1;
  undefined1 (*pauVar2) [16];
  undefined8 *puVar3;
  sunrealtype sVar4;
  double __x;
  double __x_00;
  double dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  
  *nflagPtr = 0;
  *dsmPtr = 0.0;
  puVar1 = (undefined8 *)ark_mem->step_mem;
  if (puVar1 == (undefined8 *)0x0) {
    arkProcessError(ark_mem,-0x15,0x869,"lsrkStep_TakeStepSSPs3",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                    ,"Time step module memory is NULL.");
    return -0x15;
  }
  pauVar2 = (undefined1 (*) [16])puVar1[0x12];
  puVar3 = (undefined8 *)puVar1[0x13];
  __x = (double)*(int *)(puVar1 + 3);
  if (*(int *)(puVar1 + 3) < 1) {
    __x_00 = 0.0;
  }
  else if (__x < 0.0) {
    __x_00 = sqrt(__x);
  }
  else {
    __x_00 = SQRT(__x);
  }
  dVar5 = round(__x_00);
  if (ark_mem->fn_is_current == 0) {
    iVar6 = (*(code *)*puVar1)(SUB84(ark_mem->tn,0),ark_mem->yn,ark_mem->fn,ark_mem->user_data);
    puVar1[4] = puVar1[4] + 1;
    if (iVar6 != 0) {
      return -8;
    }
    ark_mem->fn_is_current = 1;
  }
  dVar14 = 1.0 / (__x - __x_00);
  N_VLinearSum(0,ark_mem->h * dVar14,ark_mem->yn,ark_mem->fn,ark_mem->ycur);
  if (ark_mem->fixedstep == 0) {
    N_VLinearSum(0,ark_mem->h / __x,ark_mem->yn,ark_mem->fn,ark_mem->tempv1);
  }
  if ((ark_mem->ProcessStage != (ARKPostProcessFn)0x0) &&
     (iVar6 = (*ark_mem->ProcessStage)
                        (ark_mem->h * dVar14 + ark_mem->tn,ark_mem->ycur,ark_mem->user_data),
     iVar6 != 0)) {
    return -0x26;
  }
  iVar6 = (int)dVar5;
  iVar8 = (iVar6 + -2) * (iVar6 + -1);
  iVar9 = iVar8 / 2;
  if (3 < iVar8) {
    iVar8 = 2;
    iVar10 = 2;
    if (2 < iVar9) {
      iVar8 = iVar9;
    }
    do {
      iVar7 = (*(code *)*puVar1)(SUB84((double)(iVar10 + -1) * dVar14 * ark_mem->h + ark_mem->tcur,0
                                      ),ark_mem->ycur,ark_mem->tempv3,ark_mem->user_data);
      puVar1[4] = puVar1[4] + 1;
      if (iVar7 < 0) {
        return -8;
      }
      if (iVar7 != 0) {
        return 9;
      }
      N_VLinearSum(0,ark_mem->h * dVar14,ark_mem->ycur,ark_mem->tempv3,ark_mem->ycur);
      if (ark_mem->fixedstep == 0) {
        N_VLinearSum(0,ark_mem->h / __x,ark_mem->tempv1,ark_mem->tempv3,ark_mem->tempv1);
      }
      if ((ark_mem->ProcessStage != (ARKPostProcessFn)0x0) &&
         (iVar7 = (*ark_mem->ProcessStage)
                            ((double)iVar10 * dVar14 * ark_mem->h + ark_mem->tcur,ark_mem->ycur,
                             ark_mem->user_data), iVar7 != 0)) {
        return -0x26;
      }
      bVar11 = iVar10 != iVar8;
      iVar10 = iVar10 + 1;
    } while (bVar11);
  }
  N_VScale(0,ark_mem->ycur,ark_mem->tempv2);
  iVar6 = ((iVar6 + 1) * iVar6) / 2;
  if (iVar9 < iVar6 + -1) {
    do {
      dVar5 = (double)iVar9;
      iVar9 = iVar9 + 1;
      iVar8 = (*(code *)*puVar1)(SUB84(dVar5 * dVar14 * ark_mem->h + ark_mem->tcur,0),ark_mem->ycur,
                                 ark_mem->tempv3,ark_mem->user_data);
      puVar1[4] = puVar1[4] + 1;
      if (iVar8 < 0) {
        return -8;
      }
      if (iVar8 != 0) {
        return 9;
      }
      N_VLinearSum(0,ark_mem->h * dVar14,ark_mem->ycur,ark_mem->tempv3,ark_mem->ycur);
      if (ark_mem->fixedstep == 0) {
        N_VLinearSum(0,ark_mem->h / __x,ark_mem->tempv1,ark_mem->tempv3,ark_mem->tempv1);
      }
      if ((ark_mem->ProcessStage != (ARKPostProcessFn)0x0) &&
         (iVar8 = (*ark_mem->ProcessStage)
                            ((double)iVar9 * dVar14 * ark_mem->h + ark_mem->tcur,ark_mem->ycur,
                             ark_mem->user_data), iVar8 != 0)) {
        return -0x26;
      }
    } while (iVar6 + -1 != iVar9);
  }
  iVar8 = (*(code *)*puVar1)(SUB84(((__x_00 + 1.0) * __x_00 * 0.5 + -1.0) * dVar14 * ark_mem->h +
                                   ark_mem->tcur,0),ark_mem->ycur,ark_mem->tempv3,ark_mem->user_data
                            );
  puVar1[4] = puVar1[4] + 1;
  if (-1 < iVar8) {
    if (iVar8 != 0) {
      return 9;
    }
    dVar15 = __x_00 + -1.0;
    dVar5 = __x_00 + __x_00 + -1.0;
    *puVar3 = ark_mem->ycur;
    auVar12._8_8_ = __x_00;
    auVar12._0_8_ = dVar15;
    auVar13._8_8_ = dVar5;
    auVar13._0_8_ = dVar5;
    auVar13 = divpd(auVar12,auVar13);
    *pauVar2 = auVar13;
    puVar3[1] = ark_mem->tempv2;
    *(double *)pauVar2[1] = (dVar15 * dVar14 * ark_mem->h) / dVar5;
    puVar3[2] = ark_mem->tempv3;
    iVar8 = N_VLinearCombination(3,pauVar2,puVar3,ark_mem->ycur);
    if (iVar8 != 0) {
      return -0x1c;
    }
    if (ark_mem->fixedstep == 0) {
      N_VLinearSum(0,ark_mem->h / __x,ark_mem->tempv1,ark_mem->tempv3,ark_mem->tempv1);
    }
    if ((ark_mem->ProcessStage != (ARKPostProcessFn)0x0) &&
       (iVar8 = (*ark_mem->ProcessStage)
                          (dVar15 * __x_00 * 0.5 * dVar14 * ark_mem->h + ark_mem->tcur,ark_mem->ycur
                           ,ark_mem->user_data), iVar8 != 0)) {
      return -0x26;
    }
    bVar11 = SBORROW4(iVar6,*(int *)(puVar1 + 3));
    iVar8 = iVar6 - *(int *)(puVar1 + 3);
    while( true ) {
      if (bVar11 == iVar8 < 0) {
        if (ark_mem->fixedstep == 0) {
          N_VLinearSum(0,0xbff0000000000000,ark_mem->ycur,ark_mem->tempv1);
          sVar4 = (sunrealtype)N_VWrmsNorm(ark_mem->tempv1,ark_mem->ewt);
          *dsmPtr = sVar4;
          return 0;
        }
        return 0;
      }
      iVar6 = iVar6 + 1;
      iVar8 = (*(code *)*puVar1)(SUB84((((double)iVar6 - __x_00) + -1.0) * dVar14 * ark_mem->h +
                                       ark_mem->tcur,0),ark_mem->ycur,ark_mem->tempv3,
                                 ark_mem->user_data);
      puVar1[4] = puVar1[4] + 1;
      if (iVar8 < 0) break;
      if (iVar8 != 0) {
        return 9;
      }
      N_VLinearSum(0,ark_mem->h * dVar14,ark_mem->ycur,ark_mem->tempv3,ark_mem->ycur);
      if (ark_mem->fixedstep == 0) {
        N_VLinearSum(0,ark_mem->h / __x,ark_mem->tempv1,ark_mem->tempv3,ark_mem->tempv1);
      }
      iVar8 = *(int *)(puVar1 + 3);
      if ((ark_mem->ProcessStage != (ARKPostProcessFn)0x0) && (iVar6 < iVar8)) {
        iVar8 = (*ark_mem->ProcessStage)
                          (((double)iVar6 - __x_00) * dVar14 * ark_mem->h + ark_mem->tcur,
                           ark_mem->ycur,ark_mem->user_data);
        if (iVar8 != 0) {
          return -0x26;
        }
        iVar8 = *(int *)(puVar1 + 3);
      }
      bVar11 = SBORROW4(iVar6,iVar8);
      iVar8 = iVar6 - iVar8;
    }
  }
  return -8;
}

Assistant:

int lsrkStep_TakeStepSSPs3(ARKodeMem ark_mem, sunrealtype* dsmPtr, int* nflagPtr)
{
  int retval;
  ARKodeLSRKStepMem step_mem;

  /* initialize algebraic solver convergence flag to success,
     temporal error estimate to zero */
  *nflagPtr = ARK_SUCCESS;
  *dsmPtr   = ZERO;

  /* access ARKodeLSRKStepMem structure */
  retval = lsrkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  sunrealtype* cvals = step_mem->cvals;
  N_Vector* Xvecs    = step_mem->Xvecs;

  sunrealtype rs  = (sunrealtype)step_mem->req_stages;
  sunrealtype rn  = SUNRsqrt(rs);
  sunrealtype rat = ONE / (rs - rn);
  int in          = (int)SUNRround(rn);

  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, 0,
             ark_mem->tcur);
  SUNLogExtraDebugVec(ARK_LOGGER, "stage", ark_mem->yn, "z_0(:) =");

  /* The method is not FSAL. Therefore, fn ​is computed at the beginning
     of the step unless ARKODE updated fn. */
  if (!ark_mem->fn_is_current)
  {
    retval = step_mem->fe(ark_mem->tn, ark_mem->yn, ark_mem->fn,
                          ark_mem->user_data);
    step_mem->nfe++;
    if (retval != ARK_SUCCESS)
    {
      SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->fn, "F_0(:) =");
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);
      return (ARK_RHSFUNC_FAIL);
    }
    ark_mem->fn_is_current = SUNTRUE;
  }

  SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->fn, "F_0(:) =");
  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, 1,
             ark_mem->tn + rat * ark_mem->h);

  N_VLinearSum(ONE, ark_mem->yn, ark_mem->h * rat, ark_mem->fn, ark_mem->ycur);
  if (!ark_mem->fixedstep)
  {
    N_VLinearSum(ONE, ark_mem->yn, ark_mem->h / rs, ark_mem->fn, ark_mem->tempv1);
  }

  /* apply user-supplied stage postprocessing function (if supplied) */
  if (ark_mem->ProcessStage != NULL)
  {
    retval = ark_mem->ProcessStage(ark_mem->tn + ark_mem->h * rat,
                                   ark_mem->ycur, ark_mem->user_data);
    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed postprocess stage, retval = %i", retval);
      return ARK_POSTPROCESS_STAGE_FAIL;
    }
  }

  /* Evaluate stages j = 2,...,step_mem->req_stages */
  for (int j = 2; j <= ((in - 1) * (in - 2) / 2); j++)
  {
    retval =
      step_mem->fe(ark_mem->tcur + ((sunrealtype)j - ONE) * rat * ark_mem->h,
                   ark_mem->ycur, ark_mem->tempv3, ark_mem->user_data);
    step_mem->nfe++;

    SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3,
                        "F_%i(:) =", j - 1);
    SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);

    if (retval < 0) { return ARK_RHSFUNC_FAIL; }
    if (retval > 0) { return RHSFUNC_RECVR; }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
    SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, j,
               ark_mem->tn + j * rat * ark_mem->h);

    N_VLinearSum(ONE, ark_mem->ycur, ark_mem->h * rat, ark_mem->tempv3,
                 ark_mem->ycur);
    if (!ark_mem->fixedstep)
    {
      N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                   ark_mem->tempv1);
    }

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur + j * rat * ark_mem->h,
                                     ark_mem->ycur, ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return ARK_POSTPROCESS_STAGE_FAIL;
      }
    }
  }

  N_VScale(ONE, ark_mem->ycur, ark_mem->tempv2);

  for (int j = ((in - 1) * (in - 2) / 2 + 1); j <= (in * (in + 1) / 2 - 1); j++)
  {
    retval =
      step_mem->fe(ark_mem->tcur + ((sunrealtype)j - ONE) * rat * ark_mem->h,
                   ark_mem->ycur, ark_mem->tempv3, ark_mem->user_data);
    step_mem->nfe++;

    SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3,
                        "F_%i(:) =", j - 1);
    SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);

    if (retval < 0) { return ARK_RHSFUNC_FAIL; }
    if (retval > 0) { return RHSFUNC_RECVR; }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
    SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, j,
               ark_mem->tn + j * rat * ark_mem->h);

    N_VLinearSum(ONE, ark_mem->ycur, ark_mem->h * rat, ark_mem->tempv3,
                 ark_mem->ycur);
    if (!ark_mem->fixedstep)
    {
      N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                   ark_mem->tempv1);
    }

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur + j * rat * ark_mem->h,
                                     ark_mem->ycur, ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return ARK_POSTPROCESS_STAGE_FAIL;
      }
    }
  }

  retval = step_mem->fe(ark_mem->tcur +
                          rat * (rn * (rn + ONE) / TWO - ONE) * ark_mem->h,
                        ark_mem->ycur, ark_mem->tempv3, ark_mem->user_data);
  step_mem->nfe++;

  SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3,
                      "F_%i(:) =", in * (in + 1) / 2 - 1);
  SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
               "status = failed rhs eval, retval = %i", retval);

  if (retval < 0) { return ARK_RHSFUNC_FAIL; }
  if (retval > 0) { return RHSFUNC_RECVR; }

  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G,
             (in * (in + 1) / 2),
             ark_mem->tn + (in * (in - 1) / 2) * rat * ark_mem->h);

  cvals[0] = (rn - ONE) / (TWO * rn - ONE);
  Xvecs[0] = ark_mem->ycur;
  cvals[1] = rn / (TWO * rn - ONE);
  Xvecs[1] = ark_mem->tempv2;
  cvals[2] = (rn - ONE) * rat * ark_mem->h / (TWO * rn - ONE);
  Xvecs[2] = ark_mem->tempv3;

  retval = N_VLinearCombination(3, cvals, Xvecs, ark_mem->ycur);
  if (retval != 0)
  {
    SUNLogInfo(ARK_LOGGER, "end-stage",
               "status = failed vector op, retval = %i", retval);
    return ARK_VECTOROP_ERR;
  }

  if (!ark_mem->fixedstep)
  {
    N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                 ark_mem->tempv1);
  }

  /* apply user-supplied stage postprocessing function (if supplied) */
  if (ark_mem->ProcessStage != NULL)
  {
    retval = ark_mem->ProcessStage(ark_mem->tcur +
                                     rat * (rn * (rn - ONE) / TWO) * ark_mem->h,
                                   ark_mem->ycur, ark_mem->user_data);
    if (retval != 0) { return ARK_POSTPROCESS_STAGE_FAIL; }
  }

  for (int j = (in * (in + 1) / 2 + 1); j <= step_mem->req_stages; j++)
  {
    retval = step_mem->fe(ark_mem->tcur +
                            ((sunrealtype)j - rn - ONE) * rat * ark_mem->h,
                          ark_mem->ycur, ark_mem->tempv3, ark_mem->user_data);
    step_mem->nfe++;

    SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3,
                        "F_%i(:) =", j - 1);
    SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);

    if (retval < 0) { return ARK_RHSFUNC_FAIL; }
    if (retval > 0) { return RHSFUNC_RECVR; }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
    SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, j,
               ark_mem->tn + ((sunrealtype)j - rn) * rat * ark_mem->h);

    N_VLinearSum(ONE, ark_mem->ycur, ark_mem->h * rat, ark_mem->tempv3,
                 ark_mem->ycur);
    if (!ark_mem->fixedstep)
    {
      N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                   ark_mem->tempv1);
    }

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL && j < step_mem->req_stages)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur +
                                       ((sunrealtype)j - rn) * rat * ark_mem->h,
                                     ark_mem->ycur, ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return ARK_POSTPROCESS_STAGE_FAIL;
      }
    }
  }

  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogExtraDebugVec(ARK_LOGGER, "updated solution", ark_mem->ycur, "ycur(:) =");
  SUNLogInfo(ARK_LOGGER, "begin-compute-embedding", "");

  /* Compute yerr (if step adaptivity enabled) */
  if (!ark_mem->fixedstep)
  {
    SUNLogExtraDebugVec(ARK_LOGGER, "embedded solution", ark_mem->tempv1,
                        "y_embedded(:) =");
    N_VLinearSum(ONE, ark_mem->ycur, -ONE, ark_mem->tempv1, ark_mem->tempv1);
    *dsmPtr = N_VWrmsNorm(ark_mem->tempv1, ark_mem->ewt);
  }

  SUNLogInfo(ARK_LOGGER, "end-compute-embedding", "status = success");

  return ARK_SUCCESS;
}